

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

uint64_t roaring_bitmap_get_cardinality(roaring_bitmap_t *r)

{
  uint8_t uVar1;
  int iVar2;
  run_container_t *run;
  uint64_t uVar3;
  long lVar4;
  
  if ((r->high_low_container).size < 1) {
    uVar3 = 0;
  }
  else {
    lVar4 = 0;
    uVar3 = 0;
    do {
      run = (run_container_t *)(r->high_low_container).containers[lVar4];
      uVar1 = (r->high_low_container).typecodes[lVar4];
      if (uVar1 == '\x04') {
        uVar1 = *(uint8_t *)&run->runs;
        run = *(run_container_t **)run;
      }
      if (uVar1 == '\x03') {
        iVar2 = run_container_cardinality(run);
      }
      else {
        iVar2 = run->n_runs;
      }
      uVar3 = uVar3 + (long)iVar2;
      lVar4 = lVar4 + 1;
    } while (lVar4 < (r->high_low_container).size);
  }
  return uVar3;
}

Assistant:

uint64_t roaring_bitmap_get_cardinality(const roaring_bitmap_t *r) {
    const roaring_array_t *ra = &r->high_low_container;

    uint64_t card = 0;
    for (int i = 0; i < ra->size; ++i)
        card += container_get_cardinality(ra->containers[i], ra->typecodes[i]);
    return card;
}